

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerExceptionManager::cmDebuggerExceptionManager
          (cmDebuggerExceptionManager *this,Session *dapSession)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *this_00;
  unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
  *this_01;
  Session *pSVar1;
  TypeInfo *pTVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  allocator<char> local_66;
  allocator<char> local_65;
  key_type local_64;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  string local_40 [32];
  
  this->DapSession = dapSession;
  (this->Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this_00 = &this->RaiseExceptions;
  (this->RaiseExceptions)._M_h._M_buckets = &(this->RaiseExceptions)._M_h._M_single_bucket;
  (this->RaiseExceptions)._M_h._M_bucket_count = 1;
  (this->RaiseExceptions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->RaiseExceptions)._M_h._M_element_count = 0;
  (this->RaiseExceptions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->RaiseExceptions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->RaiseExceptions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = &this->ExceptionMap;
  (this->ExceptionMap)._M_h._M_buckets = &(this->ExceptionMap)._M_h._M_single_bucket;
  (this->ExceptionMap)._M_h._M_bucket_count = 1;
  (this->ExceptionMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ExceptionMap)._M_h._M_element_count = 0;
  (this->ExceptionMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ExceptionMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ExceptionMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->TheException).super__Optional_base<cmDebugger::cmDebuggerException,_false,_false>.
  _M_payload.super__Optional_payload<cmDebugger::cmDebuggerException,_true,_false,_false>.
  super__Optional_payload_base<cmDebugger::cmDebuggerException>._M_engaged = false;
  pTVar2 = dap::TypeOf<dap::SetExceptionBreakpointsRequest>::type();
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  (*dapSession->_vptr_Session[7])(dapSession,pTVar2);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  pSVar1 = this->DapSession;
  pTVar2 = dap::TypeOf<dap::ExceptionInfoRequest>::type();
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  (*pSVar1->_vptr_Session[7])(pSVar1,pTVar2);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"AUTHOR_WARNING",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Warning (dev)",&local_66);
  local_64 = AUTHOR_WARNING;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"AUTHOR_ERROR",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Error (dev)",&local_66);
  local_64 = AUTHOR_ERROR;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"FATAL_ERROR",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Fatal error",&local_66);
  local_64 = FATAL_ERROR;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"INTERNAL_ERROR",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Internal error",&local_66);
  local_64 = INTERNAL_ERROR;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"MESSAGE",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Other messages",&local_66);
  local_64 = MESSAGE;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"WARNING",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Warning",&local_66);
  local_64 = WARNING;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60._M_pod_data,"LOG",&local_65)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Debug log",&local_66);
  local_64 = LOG;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"DEPRECATION_ERROR",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Deprecation error",&local_66);
  local_64 = DEPRECATION_ERROR;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"DEPRECATION_WARNING",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Deprecation warning",&local_66);
  local_64 = DEPRECATION_WARNING;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,&local_64);
  cmDebuggerExceptionFilter::operator=(pmVar3,(cmDebuggerExceptionFilter *)&local_60);
  cmDebuggerExceptionFilter::~cmDebuggerExceptionFilter((cmDebuggerExceptionFilter *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"AUTHOR_ERROR",(allocator<char> *)&local_64);
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)&local_60);
  *pmVar4 = true;
  std::__cxx11::string::~string((string *)local_60._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"FATAL_ERROR",(allocator<char> *)&local_64);
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)&local_60);
  *pmVar4 = true;
  std::__cxx11::string::~string((string *)local_60._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"INTERNAL_ERROR",(allocator<char> *)&local_64);
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)&local_60);
  *pmVar4 = true;
  std::__cxx11::string::~string((string *)local_60._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60._M_pod_data,"DEPRECATION_ERROR",(allocator<char> *)&local_64);
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)&local_60);
  *pmVar4 = true;
  std::__cxx11::string::~string((string *)local_60._M_pod_data);
  return;
}

Assistant:

cmDebuggerExceptionManager::cmDebuggerExceptionManager(
  dap::Session* dapSession)
  : DapSession(dapSession)
{
  // https://microsoft.github.io/debug-adapter-protocol/specification#Requests_SetExceptionBreakpoints
  DapSession->registerHandler(
    [&](const dap::SetExceptionBreakpointsRequest& request) {
      return HandleSetExceptionBreakpointsRequest(request);
    });

  // https://microsoft.github.io/debug-adapter-protocol/specification#Requests_ExceptionInfo
  DapSession->registerHandler([&](const dap::ExceptionInfoRequest& request) {
    (void)request;
    return HandleExceptionInfoRequest();
  });

  ExceptionMap[MessageType::AUTHOR_WARNING] =
    cmDebuggerExceptionFilter{ "AUTHOR_WARNING", "Warning (dev)" };
  ExceptionMap[MessageType::AUTHOR_ERROR] =
    cmDebuggerExceptionFilter{ "AUTHOR_ERROR", "Error (dev)" };
  ExceptionMap[MessageType::FATAL_ERROR] =
    cmDebuggerExceptionFilter{ "FATAL_ERROR", "Fatal error" };
  ExceptionMap[MessageType::INTERNAL_ERROR] =
    cmDebuggerExceptionFilter{ "INTERNAL_ERROR", "Internal error" };
  ExceptionMap[MessageType::MESSAGE] =
    cmDebuggerExceptionFilter{ "MESSAGE", "Other messages" };
  ExceptionMap[MessageType::WARNING] =
    cmDebuggerExceptionFilter{ "WARNING", "Warning" };
  ExceptionMap[MessageType::LOG] =
    cmDebuggerExceptionFilter{ "LOG", "Debug log" };
  ExceptionMap[MessageType::DEPRECATION_ERROR] =
    cmDebuggerExceptionFilter{ "DEPRECATION_ERROR", "Deprecation error" };
  ExceptionMap[MessageType::DEPRECATION_WARNING] =
    cmDebuggerExceptionFilter{ "DEPRECATION_WARNING", "Deprecation warning" };
  RaiseExceptions["AUTHOR_ERROR"] = true;
  RaiseExceptions["FATAL_ERROR"] = true;
  RaiseExceptions["INTERNAL_ERROR"] = true;
  RaiseExceptions["DEPRECATION_ERROR"] = true;
}